

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugScreen.cpp
# Opt level: O0

int DebugScreen::init(EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  Vector2<unsigned_int> *unaff_retaddr;
  uint *in_stack_00000008;
  Font *in_stack_00000010;
  Private *in_stack_00000018;
  unique_ptr<DebugScreen,_std::default_delete<DebugScreen>_> *in_stack_ffffffffffffffd8;
  unique_ptr<DebugScreen,_std::default_delete<DebugScreen>_> *in_stack_ffffffffffffffe0;
  
  details::
  make_unique<DebugScreen,_DebugScreen::Private,_const_sf::Font_&,_unsigned_int_&,_const_sf::Vector2<unsigned_int>_&,_0>
            (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr);
  std::unique_ptr<DebugScreen,_std::default_delete<DebugScreen>_>::operator=
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::unique_ptr<DebugScreen,_std::default_delete<DebugScreen>_>::~unique_ptr
            (in_stack_ffffffffffffffe0);
  return extraout_EAX;
}

Assistant:

void DebugScreen::init(const sf::Font& font, unsigned int characterSize, const sf::Vector2u& windowSize) {
    assert(!instance_);
    instance_ = details::make_unique<DebugScreen>(Private(), font, characterSize, windowSize);
}